

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

vector<std::shared_ptr<TgBot::GameHighScore>,_std::allocator<std::shared_ptr<TgBot::GameHighScore>_>_>
* __thiscall
TgBot::Api::getGameHighScores
          (vector<std::shared_ptr<TgBot::GameHighScore>,_std::allocator<std::shared_ptr<TgBot::GameHighScore>_>_>
           *__return_storage_ptr__,Api *this,int32_t userId,int32_t score,bool force,
          bool disableEditMessage,int64_t chatId,int32_t messageId,string *inlineMessageId)

{
  int64_t iVar1;
  int32_t iVar2;
  bool disableEditMessage_local;
  bool force_local;
  allocator local_a1;
  int32_t score_local;
  int32_t userId_local;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  string local_78;
  ptree local_58;
  
  iVar2 = messageId;
  iVar1 = chatId;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  disableEditMessage_local = disableEditMessage;
  force_local = force;
  score_local = score;
  userId_local = userId;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve(&args,7);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],int&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
             (char (*) [8])"user_id",&userId_local);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[6],int&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
             (char (*) [6])0x270ddb,&score_local);
  if (force) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[6],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [6])"force",&force_local);
  }
  if (disableEditMessage) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[21],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [21])"disable_edit_message",&disableEditMessage_local);
  }
  if (iVar1 != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[8],long&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [8])0x27334a,&chatId);
  }
  if (iVar2 != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[11],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [11])0x27193c,&messageId);
  }
  if (inlineMessageId->_M_string_length != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[18],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [18])"inline_message_id",inlineMessageId);
  }
  std::__cxx11::string::string((string *)&local_78,"getGameHighScores",&local_a1);
  sendRequest(&local_58,this,&local_78,&args);
  TgTypeParser::parseJsonAndGetArray<TgBot::GameHighScore>
            (__return_storage_ptr__,(TgTypeParser *)&this->field_0x28,0x1e7752,(ptree *)0x0);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&args);
  return __return_storage_ptr__;
}

Assistant:

vector<GameHighScore::Ptr> Api::getGameHighScores(int32_t userId, int32_t score, bool force, bool disableEditMessage, int64_t chatId, int32_t messageId, const std::string& inlineMessageId) const {
    vector<HttpReqArg> args;
    args.reserve(7);
    args.emplace_back("user_id", userId);
    args.emplace_back("score", score);
    if (force) {
        args.emplace_back("force", force);
    }
    if (disableEditMessage) {
        args.emplace_back("disable_edit_message", disableEditMessage);
    }
    if (chatId) {
        args.emplace_back("chat_id", chatId);
    }
    if (messageId) {
        args.emplace_back("message_id", messageId);
    }
    if (!inlineMessageId.empty()){
        args.emplace_back("inline_message_id", inlineMessageId);
    }
    return _tgTypeParser.parseJsonAndGetArray<GameHighScore>(&TgTypeParser::parseJsonAndGetGameHighScore, sendRequest("getGameHighScores", args));
}